

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::AssertionVisitor::visit(AssertionVisitor *this,AssertBase *stmt)

{
  allocator<std::shared_ptr<kratos::Var>_> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  initializer_list<std::shared_ptr<kratos::Var>_> __l;
  bool bVar1;
  int iVar2;
  PropertyAction PVar3;
  reference __in;
  type *ptVar4;
  Generator *pGVar5;
  element_type *peVar6;
  shared_ptr<kratos::Var> *local_1a8;
  shared_ptr<kratos::Stmt> local_168;
  Property *local_158;
  Property *prop;
  shared_ptr<kratos::AssertPropertyStmt> st_1;
  AssertValueStmt *st;
  shared_ptr<kratos::FunctionCallStmt> else_stmt;
  undefined1 local_110 [32];
  shared_ptr<kratos::Var> local_f0;
  shared_ptr<kratos::Var> local_e0;
  vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> local_d0;
  undefined1 local_b8 [8];
  shared_ptr<kratos::FunctionCallVar> else_call;
  shared_ptr<kratos::GeneratorConst> gen_var;
  shared_ptr<kratos::Var> line_num_var;
  string local_78;
  undefined1 local_58 [8];
  shared_ptr<kratos::Var> filename_var;
  type *line_num;
  type *filename;
  undefined1 local_30 [24];
  Generator *generator;
  AssertBase *stmt_local;
  AssertionVisitor *this_local;
  
  generator = (Generator *)stmt;
  stmt_local = (AssertBase *)this;
  bVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::empty(&(stmt->super_Stmt).super_IRNode.fn_name_ln);
  if (!bVar1) {
    local_30._16_8_ = Stmt::generator_parent((Stmt *)generator);
    bVar1 = Generator::has_function
                      ((Generator *)local_30._16_8_,(string *)hgdb_assert_fail_abi_cxx11_);
    if (!bVar1) {
      Generator::builtin_function((Generator *)local_30,(string *)local_30._16_8_);
      std::shared_ptr<kratos::BuiltInFunctionStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::BuiltInFunctionStmtBlock> *)local_30);
    }
    __in = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&(generator->super_IRNode).fn_name_ln,0);
    ptVar4 = std::get<0ul,std::__cxx11::string,unsigned_int>(__in);
    filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::get<1ul,std::__cxx11::string,unsigned_int>(__in);
    std::__cxx11::string::string((string *)&local_78,(string *)ptVar4);
    iVar2 = std::__cxx11::string::size();
    Const::constant(&local_78,iVar2 << 3);
    std::enable_shared_from_this<kratos::Var>::shared_from_this
              ((enable_shared_from_this<kratos::Var> *)local_58);
    std::__cxx11::string::~string((string *)&local_78);
    Const::constant((ulong)*(uint *)&(filename_var.
                                      super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi)->_vptr__Sp_counted_base,0x20,false);
    std::enable_shared_from_this<kratos::Var>::shared_from_this
              ((enable_shared_from_this<kratos::Var> *)
               &gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::make_shared<kratos::GeneratorConst,kratos::Generator&>
              ((Generator *)
               &else_call.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pGVar5 = Stmt::generator_parent((Stmt *)generator);
    std::shared_ptr<kratos::Var>::shared_ptr<kratos::GeneratorConst,void>
              ((shared_ptr<kratos::Var> *)local_110,
               (shared_ptr<kratos::GeneratorConst> *)
               &else_call.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<kratos::Var>::shared_ptr
              ((shared_ptr<kratos::Var> *)(local_110 + 0x10),(shared_ptr<kratos::Var> *)local_58);
    std::shared_ptr<kratos::Var>::shared_ptr
              (&local_f0,
               (shared_ptr<kratos::Var> *)
               &gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_e0.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
    this_00 = (allocator<std::shared_ptr<kratos::Var>_> *)
              ((long)&else_stmt.
                      super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + 7);
    local_e0.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_110;
    std::allocator<std::shared_ptr<kratos::Var>_>::allocator(this_00);
    __l._M_len = (size_type)
                 local_e0.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
    __l._M_array = (iterator)
                   local_e0.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
    vector(&local_d0,__l,this_00);
    Generator::call(pGVar5,(string *)hgdb_assert_fail_abi_cxx11_,&local_d0);
    Var::as<kratos::FunctionCallVar>((Var *)local_b8);
    std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
    ~vector(&local_d0);
    std::allocator<std::shared_ptr<kratos::Var>_>::~allocator
              ((allocator<std::shared_ptr<kratos::Var>_> *)
               ((long)&else_stmt.
                       super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    local_1a8 = &local_e0;
    do {
      local_1a8 = local_1a8 + -1;
      std::shared_ptr<kratos::Var>::~shared_ptr(local_1a8);
    } while (local_1a8 != (shared_ptr<kratos::Var> *)local_110);
    std::make_shared<kratos::FunctionCallStmt,std::shared_ptr<kratos::FunctionCallVar>&>
              ((shared_ptr<kratos::FunctionCallVar> *)&st);
    iVar2 = (*(generator->super_IRNode)._vptr_IRNode[0xd])();
    pGVar5 = generator;
    if (iVar2 == 0) {
      this_01 = &st_1.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::FunctionCallStmt,void>
                ((shared_ptr<kratos::Stmt> *)this_01,(shared_ptr<kratos::FunctionCallStmt> *)&st);
      AssertValueStmt::set_else((AssertValueStmt *)pGVar5,(shared_ptr<kratos::Stmt> *)this_01);
      std::shared_ptr<kratos::Stmt>::~shared_ptr
                ((shared_ptr<kratos::Stmt> *)
                 &st_1.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      Stmt::as<kratos::AssertPropertyStmt>((Stmt *)&prop);
      peVar6 = std::
               __shared_ptr_access<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&prop);
      local_158 = AssertPropertyStmt::property(peVar6);
      PVar3 = Property::action(local_158);
      if (PVar3 == Assert) {
        peVar6 = std::
                 __shared_ptr_access<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&prop);
        std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::FunctionCallStmt,void>
                  (&local_168,(shared_ptr<kratos::FunctionCallStmt> *)&st);
        AssertPropertyStmt::set_else(peVar6,&local_168);
        std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_168);
      }
      std::shared_ptr<kratos::AssertPropertyStmt>::~shared_ptr
                ((shared_ptr<kratos::AssertPropertyStmt> *)&prop);
    }
    std::shared_ptr<kratos::FunctionCallStmt>::~shared_ptr
              ((shared_ptr<kratos::FunctionCallStmt> *)&st);
    std::shared_ptr<kratos::FunctionCallVar>::~shared_ptr
              ((shared_ptr<kratos::FunctionCallVar> *)local_b8);
    std::shared_ptr<kratos::GeneratorConst>::~shared_ptr
              ((shared_ptr<kratos::GeneratorConst> *)
               &else_call.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<kratos::Var>::~shared_ptr
              ((shared_ptr<kratos::Var> *)
               &gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_58);
  }
  return;
}

Assistant:

void visit(AssertBase *stmt) override {
        if (stmt->fn_name_ln.empty()) return;
        auto *generator = stmt->generator_parent();
        if (!generator->has_function(hgdb_assert_fail)) {
            generator->builtin_function(hgdb_assert_fail);
        }
        auto const &[filename, line_num] = stmt->fn_name_ln[0];
        auto filename_var = Const::constant(filename, filename.size() * 8).shared_from_this();
        auto line_num_var =
            Const::constant(static_cast<int64_t>(line_num), 32, false).shared_from_this();
        auto gen_var = std::make_shared<GeneratorConst>(*generator);
        auto else_call = stmt->generator_parent()
                             ->call(hgdb_assert_fail, {gen_var, filename_var, line_num_var})
                             .as<FunctionCallVar>();
        auto else_stmt = std::make_shared<FunctionCallStmt>(else_call);
        if (stmt->assert_type() == AssertType::AssertValue) {
            auto *st = reinterpret_cast<AssertValueStmt *>(stmt);
            st->set_else(else_stmt);
        } else {
            auto st = stmt->as<AssertPropertyStmt>();
            auto *prop = st->property();
            if (prop->action() == PropertyAction::Assert) {
                st->set_else(else_stmt);
            }
        }
    }